

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_ngeom(REF_NODE ref_node,REF_GEOM ref_geom,REF_INT type,REF_INT *ngeom)

{
  REF_MPI ref_mpi;
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  REF_INT ngeom_local;
  int local_1c;
  
  ref_mpi = ref_node->ref_mpi;
  local_1c = 0;
  if (0 < (long)ref_geom->max) {
    iVar1 = 0;
    lVar4 = 0;
    do {
      if ((*(int *)((long)ref_geom->descr + lVar4) == type) &&
         (ref_mpi->id == ref_node->part[*(int *)((long)ref_geom->descr + lVar4 + 0x14)])) {
        iVar1 = iVar1 + 1;
        local_1c = iVar1;
      }
      lVar4 = lVar4 + 0x18;
    } while ((long)ref_geom->max * 0x18 != lVar4);
  }
  uVar2 = ref_mpi_sum(ref_mpi,&local_1c,ngeom,1,1);
  if (uVar2 == 0) {
    uVar2 = ref_mpi_bcast(ref_mpi,ngeom,1,1);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar5 = "bcast";
    uVar3 = 0xcfb;
  }
  else {
    pcVar5 = "sum";
    uVar3 = 0xcfa;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar3,
         "ref_gather_ngeom",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_gather_ngeom(REF_NODE ref_node, REF_GEOM ref_geom,
                                    REF_INT type, REF_INT *ngeom) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT geom, node;
  REF_INT ngeom_local;

  ngeom_local = 0;
  each_ref_geom_of(ref_geom, type, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, node)) ngeom_local++;
  }

  RSS(ref_mpi_sum(ref_mpi, &ngeom_local, ngeom, 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_bcast(ref_mpi, ngeom, 1, REF_INT_TYPE), "bcast");

  return REF_SUCCESS;
}